

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Scene *pSVar9;
  Ref<embree::Geometry> *pRVar10;
  Geometry *pGVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  int iVar61;
  AABBNodeMB4D *node1;
  ulong uVar62;
  long lVar63;
  uint uVar64;
  ulong uVar65;
  long lVar66;
  ulong uVar67;
  long lVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong *puVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  long lVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  ulong uVar86;
  ulong uVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar121;
  float fVar127;
  float fVar128;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  float fVar142;
  float fVar146;
  float fVar147;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar145 [32];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  ulong *local_f28;
  RTCFilterFunctionNArguments local_d50;
  undefined1 local_d20 [32];
  undefined1 local_d00 [32];
  undefined1 local_ce0 [32];
  undefined1 local_cc0 [32];
  undefined1 local_ca0 [32];
  float local_c80;
  float fStack_c7c;
  float fStack_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float fStack_c68;
  float fStack_c64;
  undefined1 local_c60 [32];
  undefined1 local_c40 [32];
  undefined1 local_c20 [32];
  undefined1 local_c00 [32];
  undefined1 local_be0 [32];
  undefined1 local_bc0 [16];
  undefined1 local_bb0 [16];
  undefined1 local_ba0 [16];
  undefined1 local_b90 [16];
  undefined1 local_b80 [32];
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  undefined4 uStack_b44;
  undefined1 local_b40 [32];
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  undefined4 uStack_ad0;
  undefined4 uStack_acc;
  undefined4 uStack_ac8;
  undefined4 uStack_ac4;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  float local_9a0 [4];
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  undefined4 uStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined4 local_900;
  undefined4 uStack_8fc;
  undefined4 uStack_8f8;
  undefined4 uStack_8f4;
  undefined4 uStack_8f0;
  undefined4 uStack_8ec;
  undefined4 uStack_8e8;
  undefined4 uStack_8e4;
  undefined4 local_8e0;
  undefined4 uStack_8dc;
  undefined4 uStack_8d8;
  undefined4 uStack_8d4;
  undefined4 uStack_8d0;
  undefined4 uStack_8cc;
  undefined4 uStack_8c8;
  undefined4 uStack_8c4;
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar136._4_4_ = uVar1;
  auVar136._0_4_ = uVar1;
  auVar136._8_4_ = uVar1;
  auVar136._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar139._4_4_ = uVar1;
  auVar139._0_4_ = uVar1;
  auVar139._8_4_ = uVar1;
  auVar139._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar143._4_4_ = uVar1;
  auVar143._0_4_ = uVar1;
  auVar143._8_4_ = uVar1;
  auVar143._12_4_ = uVar1;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar35 = fVar2 * 0.99999964;
  fVar36 = fVar3 * 0.99999964;
  fVar37 = fVar4 * 0.99999964;
  fVar2 = fVar2 * 1.0000004;
  fVar3 = fVar3 * 1.0000004;
  fVar4 = fVar4 * 1.0000004;
  uVar85 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar87 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar70 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar61 = (tray->tnear).field_0.i[k];
  auVar122._4_4_ = iVar61;
  auVar122._0_4_ = iVar61;
  auVar122._8_4_ = iVar61;
  auVar122._12_4_ = iVar61;
  iVar61 = (tray->tfar).field_0.i[k];
  auVar133._4_4_ = iVar61;
  auVar133._0_4_ = iVar61;
  auVar133._8_4_ = iVar61;
  auVar133._12_4_ = iVar61;
  local_b40._16_16_ = mm_lookupmask_ps._240_16_;
  local_b40._0_16_ = mm_lookupmask_ps._0_16_;
  iVar61 = 1 << ((uint)k & 0x1f);
  auVar91._4_4_ = iVar61;
  auVar91._0_4_ = iVar61;
  auVar91._8_4_ = iVar61;
  auVar91._12_4_ = iVar61;
  auVar91._16_4_ = iVar61;
  auVar91._20_4_ = iVar61;
  auVar91._24_4_ = iVar61;
  auVar91._28_4_ = iVar61;
  auVar92 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar91 = vpand_avx2(auVar91,auVar92);
  local_b80 = vpcmpeqd_avx2(auVar91,auVar92);
  auVar97._8_4_ = 0x3f800000;
  auVar97._0_8_ = 0x3f8000003f800000;
  auVar97._12_4_ = 0x3f800000;
  auVar97._16_4_ = 0x3f800000;
  auVar97._20_4_ = 0x3f800000;
  auVar97._24_4_ = 0x3f800000;
  auVar97._28_4_ = 0x3f800000;
  auVar92._8_4_ = 0xbf800000;
  auVar92._0_8_ = 0xbf800000bf800000;
  auVar92._12_4_ = 0xbf800000;
  auVar92._16_4_ = 0xbf800000;
  auVar92._20_4_ = 0xbf800000;
  auVar92._24_4_ = 0xbf800000;
  auVar92._28_4_ = 0xbf800000;
  _local_b60 = vblendvps_avx(auVar97,auVar92,local_b40);
  local_f28 = local_7f8;
LAB_0160f5c0:
  do {
    puVar72 = local_f28;
    if (puVar72 == &local_800) {
LAB_016105f0:
      return puVar72 != &local_800;
    }
    local_f28 = puVar72 + -1;
    uVar69 = puVar72[-1];
    while ((uVar69 & 8) == 0) {
      uVar62 = uVar69 & 0xfffffffffffffff0;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar88._4_4_ = uVar1;
      auVar88._0_4_ = uVar1;
      auVar88._8_4_ = uVar1;
      auVar88._12_4_ = uVar1;
      auVar89 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar62 + 0x80 + uVar85),auVar88,
                                *(undefined1 (*) [16])(uVar62 + 0x20 + uVar85));
      auVar89 = vsubps_avx(auVar89,auVar136);
      auVar95._0_4_ = fVar35 * auVar89._0_4_;
      auVar95._4_4_ = fVar35 * auVar89._4_4_;
      auVar95._8_4_ = fVar35 * auVar89._8_4_;
      auVar95._12_4_ = fVar35 * auVar89._12_4_;
      auVar89 = vmaxps_avx(auVar122,auVar95);
      auVar95 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar62 + 0x80 + uVar87),auVar88,
                                *(undefined1 (*) [16])(uVar62 + 0x20 + uVar87));
      auVar95 = vsubps_avx(auVar95,auVar139);
      auVar102._0_4_ = fVar36 * auVar95._0_4_;
      auVar102._4_4_ = fVar36 * auVar95._4_4_;
      auVar102._8_4_ = fVar36 * auVar95._8_4_;
      auVar102._12_4_ = fVar36 * auVar95._12_4_;
      auVar95 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar62 + 0x80 + uVar70),auVar88,
                                *(undefined1 (*) [16])(uVar62 + 0x20 + uVar70));
      auVar95 = vsubps_avx(auVar95,auVar143);
      auVar108._0_4_ = fVar37 * auVar95._0_4_;
      auVar108._4_4_ = fVar37 * auVar95._4_4_;
      auVar108._8_4_ = fVar37 * auVar95._8_4_;
      auVar108._12_4_ = fVar37 * auVar95._12_4_;
      auVar95 = vmaxps_avx(auVar102,auVar108);
      auVar89 = vmaxps_avx(auVar89,auVar95);
      auVar95 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar62 + 0x80 + (uVar85 ^ 0x10)),auVar88,
                                *(undefined1 (*) [16])(uVar62 + 0x20 + (uVar85 ^ 0x10)));
      auVar95 = vsubps_avx(auVar95,auVar136);
      auVar103._0_4_ = fVar2 * auVar95._0_4_;
      auVar103._4_4_ = fVar2 * auVar95._4_4_;
      auVar103._8_4_ = fVar2 * auVar95._8_4_;
      auVar103._12_4_ = fVar2 * auVar95._12_4_;
      auVar102 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar62 + 0x80 + (uVar87 ^ 0x10)),auVar88,
                                 *(undefined1 (*) [16])(uVar62 + 0x20 + (uVar87 ^ 0x10)));
      auVar95 = vminps_avx(auVar133,auVar103);
      auVar102 = vsubps_avx(auVar102,auVar139);
      auVar109._0_4_ = fVar3 * auVar102._0_4_;
      auVar109._4_4_ = fVar3 * auVar102._4_4_;
      auVar109._8_4_ = fVar3 * auVar102._8_4_;
      auVar109._12_4_ = fVar3 * auVar102._12_4_;
      auVar102 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar62 + 0x80 + (uVar70 ^ 0x10)),auVar88,
                                 *(undefined1 (*) [16])(uVar62 + 0x20 + (uVar70 ^ 0x10)));
      auVar102 = vsubps_avx(auVar102,auVar143);
      auVar115._0_4_ = fVar4 * auVar102._0_4_;
      auVar115._4_4_ = fVar4 * auVar102._4_4_;
      auVar115._8_4_ = fVar4 * auVar102._8_4_;
      auVar115._12_4_ = fVar4 * auVar102._12_4_;
      auVar102 = vminps_avx(auVar109,auVar115);
      auVar95 = vminps_avx(auVar95,auVar102);
      if (((uint)uVar69 & 7) == 6) {
        auVar95 = vcmpps_avx(auVar89,auVar95,2);
        auVar89 = vcmpps_avx(*(undefined1 (*) [16])(uVar62 + 0xe0),auVar88,2);
        auVar102 = vcmpps_avx(auVar88,*(undefined1 (*) [16])(uVar62 + 0xf0),1);
        auVar89 = vandps_avx(auVar89,auVar102);
        auVar89 = vandps_avx(auVar89,auVar95);
      }
      else {
        auVar89 = vcmpps_avx(auVar89,auVar95,2);
      }
      auVar89 = vpslld_avx(auVar89,0x1f);
      uVar64 = vmovmskps_avx(auVar89);
      if (uVar64 == 0) goto LAB_0160f5c0;
      lVar68 = 0;
      for (uVar69 = (ulong)(byte)uVar64; (uVar69 & 1) == 0;
          uVar69 = uVar69 >> 1 | 0x8000000000000000) {
        lVar68 = lVar68 + 1;
      }
      uVar69 = *(ulong *)(uVar62 + lVar68 * 8);
      uVar64 = (uVar64 & 0xff) - 1 & uVar64 & 0xff;
      uVar65 = (ulong)uVar64;
      if (uVar64 != 0) {
        do {
          *local_f28 = uVar69;
          local_f28 = local_f28 + 1;
          lVar68 = 0;
          for (uVar69 = uVar65; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
            lVar68 = lVar68 + 1;
          }
          uVar65 = uVar65 - 1 & uVar65;
          uVar69 = *(ulong *)(uVar62 + lVar68 * 8);
        } while (uVar65 != 0);
      }
    }
    uVar62 = uVar69 & 0xfffffffffffffff0;
    for (lVar68 = 0; lVar68 != (ulong)((uint)uVar69 & 0xf) - 8; lVar68 = lVar68 + 1) {
      lVar63 = lVar68 * 0x60;
      pSVar9 = context->scene;
      pRVar10 = (pSVar9->geometries).items;
      pGVar11 = pRVar10[*(uint *)(uVar62 + 0x40 + lVar63)].ptr;
      fVar5 = (pGVar11->time_range).lower;
      fVar5 = pGVar11->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0xe0) - fVar5) / ((pGVar11->time_range).upper - fVar5));
      auVar89 = vroundss_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),9);
      auVar89 = vminss_avx(auVar89,ZEXT416((uint)(pGVar11->fnumTimeSegments + -1.0)));
      auVar104 = vmaxss_avx(ZEXT816(0) << 0x20,auVar89);
      iVar61 = (int)auVar104._0_4_;
      lVar78 = (long)iVar61 * 0x38;
      lVar12 = *(long *)(*(long *)&pGVar11[2].numPrimitives + lVar78);
      uVar81 = (ulong)*(uint *)(uVar62 + 4 + lVar63);
      auVar89 = *(undefined1 (*) [16])(lVar12 + (ulong)*(uint *)(uVar62 + lVar63) * 4);
      uVar67 = (ulong)*(uint *)(uVar62 + 0x10 + lVar63);
      auVar95 = *(undefined1 (*) [16])(lVar12 + uVar67 * 4);
      uVar73 = (ulong)*(uint *)(uVar62 + 0x20 + lVar63);
      auVar102 = *(undefined1 (*) [16])(lVar12 + uVar73 * 4);
      uVar74 = (ulong)*(uint *)(uVar62 + 0x30 + lVar63);
      auVar88 = *(undefined1 (*) [16])(lVar12 + uVar74 * 4);
      lVar12 = *(long *)&pRVar10[*(uint *)(uVar62 + 0x44 + lVar63)].ptr[2].numPrimitives;
      lVar13 = *(long *)(lVar12 + lVar78);
      auVar103 = *(undefined1 (*) [16])(lVar13 + uVar81 * 4);
      uVar75 = (ulong)*(uint *)(uVar62 + 0x14 + lVar63);
      auVar108 = *(undefined1 (*) [16])(lVar13 + uVar75 * 4);
      uVar76 = (ulong)*(uint *)(uVar62 + 0x24 + lVar63);
      auVar109 = *(undefined1 (*) [16])(lVar13 + uVar76 * 4);
      uVar77 = (ulong)*(uint *)(uVar62 + 0x34 + lVar63);
      auVar115 = *(undefined1 (*) [16])(lVar13 + uVar77 * 4);
      lVar13 = *(long *)&pRVar10[*(uint *)(uVar62 + 0x48 + lVar63)].ptr[2].numPrimitives;
      lVar14 = *(long *)(lVar13 + lVar78);
      uVar71 = (ulong)*(uint *)(uVar62 + 8 + lVar63);
      auVar110 = *(undefined1 (*) [16])(lVar14 + uVar71 * 4);
      uVar82 = (ulong)*(uint *)(uVar62 + 0x18 + lVar63);
      auVar162 = *(undefined1 (*) [16])(lVar14 + uVar82 * 4);
      uVar83 = (ulong)*(uint *)(uVar62 + 0x28 + lVar63);
      auVar7 = *(undefined1 (*) [16])(lVar14 + uVar83 * 4);
      uVar84 = (ulong)*(uint *)(uVar62 + 0x38 + lVar63);
      auVar8 = *(undefined1 (*) [16])(lVar14 + uVar84 * 4);
      fVar5 = fVar5 - auVar104._0_4_;
      lVar14 = *(long *)&pRVar10[*(uint *)(uVar62 + 0x4c + lVar63)].ptr[2].numPrimitives;
      lVar78 = *(long *)(lVar14 + lVar78);
      uVar65 = (ulong)*(uint *)(uVar62 + 0xc + lVar63);
      auVar104 = *(undefined1 (*) [16])(lVar78 + uVar65 * 4);
      uVar79 = (ulong)*(uint *)(uVar62 + 0x1c + lVar63);
      auVar90 = *(undefined1 (*) [16])(lVar78 + uVar79 * 4);
      auVar137 = vunpcklps_avx(auVar89,auVar110);
      auVar110 = vunpckhps_avx(auVar89,auVar110);
      auVar140 = vunpcklps_avx(auVar103,auVar104);
      auVar103 = vunpckhps_avx(auVar103,auVar104);
      uVar80 = (ulong)*(uint *)(uVar62 + 0x2c + lVar63);
      auVar89 = *(undefined1 (*) [16])(lVar78 + uVar80 * 4);
      auVar104 = vunpcklps_avx(auVar110,auVar103);
      local_b90 = vunpcklps_avx(auVar137,auVar140);
      auVar103 = vunpckhps_avx(auVar137,auVar140);
      auVar137 = vunpcklps_avx(auVar95,auVar162);
      auVar110 = vunpckhps_avx(auVar95,auVar162);
      auVar162 = vunpcklps_avx(auVar108,auVar90);
      auVar108 = vunpckhps_avx(auVar108,auVar90);
      uVar86 = (ulong)*(uint *)(uVar62 + 0x3c + lVar63);
      auVar95 = *(undefined1 (*) [16])(lVar78 + uVar86 * 4);
      auVar110 = vunpcklps_avx(auVar110,auVar108);
      auVar90 = vunpcklps_avx(auVar137,auVar162);
      auVar108 = vunpckhps_avx(auVar137,auVar162);
      auVar162 = vunpcklps_avx(auVar102,auVar7);
      auVar102 = vunpckhps_avx(auVar102,auVar7);
      auVar7 = vunpcklps_avx(auVar109,auVar89);
      auVar109 = vunpckhps_avx(auVar109,auVar89);
      lVar66 = (long)(iVar61 + 1) * 0x38;
      lVar78 = *(long *)(*(long *)&pGVar11[2].numPrimitives + lVar66);
      auVar89 = *(undefined1 (*) [16])(lVar78 + (ulong)*(uint *)(uVar62 + lVar63) * 4);
      auVar137 = vunpcklps_avx(auVar102,auVar109);
      auVar140 = vunpcklps_avx(auVar162,auVar7);
      local_bc0 = vunpckhps_avx(auVar162,auVar7);
      auVar109 = vunpcklps_avx(auVar88,auVar8);
      auVar102 = vunpckhps_avx(auVar88,auVar8);
      auVar162 = vunpcklps_avx(auVar115,auVar95);
      auVar88 = vunpckhps_avx(auVar115,auVar95);
      lVar13 = *(long *)(lVar13 + lVar66);
      auVar95 = *(undefined1 (*) [16])(lVar13 + uVar71 * 4);
      auVar7 = vunpcklps_avx(auVar102,auVar88);
      local_ba0 = vunpcklps_avx(auVar109,auVar162);
      local_bb0 = vunpckhps_avx(auVar109,auVar162);
      lVar12 = *(long *)(lVar12 + lVar66);
      auVar88 = vunpcklps_avx(auVar89,auVar95);
      auVar102 = vunpckhps_avx(auVar89,auVar95);
      auVar89 = *(undefined1 (*) [16])(lVar12 + uVar81 * 4);
      lVar14 = *(long *)(lVar14 + lVar66);
      auVar95 = *(undefined1 (*) [16])(lVar14 + uVar65 * 4);
      auVar109 = vunpcklps_avx(auVar89,auVar95);
      auVar89 = vunpckhps_avx(auVar89,auVar95);
      auVar162 = vunpcklps_avx(auVar102,auVar89);
      auVar8 = vunpcklps_avx(auVar88,auVar109);
      auVar102 = vunpckhps_avx(auVar88,auVar109);
      auVar89 = *(undefined1 (*) [16])(lVar78 + uVar67 * 4);
      auVar95 = *(undefined1 (*) [16])(lVar13 + uVar82 * 4);
      auVar109 = vunpcklps_avx(auVar89,auVar95);
      auVar88 = vunpckhps_avx(auVar89,auVar95);
      auVar89 = *(undefined1 (*) [16])(lVar12 + uVar75 * 4);
      auVar95 = *(undefined1 (*) [16])(lVar14 + uVar79 * 4);
      auVar115 = vunpcklps_avx(auVar89,auVar95);
      auVar89 = vunpckhps_avx(auVar89,auVar95);
      auVar144 = vunpcklps_avx(auVar88,auVar89);
      auVar123 = vunpcklps_avx(auVar109,auVar115);
      auVar88 = vunpckhps_avx(auVar109,auVar115);
      auVar89 = *(undefined1 (*) [16])(lVar78 + uVar73 * 4);
      auVar95 = *(undefined1 (*) [16])(lVar13 + uVar83 * 4);
      auVar115 = vunpcklps_avx(auVar89,auVar95);
      auVar109 = vunpckhps_avx(auVar89,auVar95);
      auVar89 = *(undefined1 (*) [16])(lVar12 + uVar76 * 4);
      auVar95 = *(undefined1 (*) [16])(lVar14 + uVar80 * 4);
      auVar96 = vunpcklps_avx(auVar89,auVar95);
      auVar89 = vunpckhps_avx(auVar89,auVar95);
      auVar41 = vunpcklps_avx(auVar109,auVar89);
      auVar152 = vunpcklps_avx(auVar115,auVar96);
      auVar109 = vunpckhps_avx(auVar115,auVar96);
      auVar89 = *(undefined1 (*) [16])(lVar78 + uVar74 * 4);
      auVar95 = *(undefined1 (*) [16])(lVar13 + uVar84 * 4);
      auVar96 = vunpcklps_avx(auVar89,auVar95);
      auVar115 = vunpckhps_avx(auVar89,auVar95);
      auVar89 = *(undefined1 (*) [16])(lVar12 + uVar77 * 4);
      auVar95 = *(undefined1 (*) [16])(lVar14 + uVar86 * 4);
      auVar116 = vunpcklps_avx(auVar89,auVar95);
      auVar89 = vunpckhps_avx(auVar89,auVar95);
      auVar95 = vunpcklps_avx(auVar115,auVar89);
      auVar115 = vunpcklps_avx(auVar96,auVar116);
      auVar89 = vunpckhps_avx(auVar96,auVar116);
      fVar40 = 1.0 - fVar5;
      auVar159._4_4_ = fVar40;
      auVar159._0_4_ = fVar40;
      auVar159._8_4_ = fVar40;
      auVar159._12_4_ = fVar40;
      auVar96._0_4_ = fVar5 * auVar8._0_4_;
      auVar96._4_4_ = fVar5 * auVar8._4_4_;
      auVar96._8_4_ = fVar5 * auVar8._8_4_;
      auVar96._12_4_ = fVar5 * auVar8._12_4_;
      auVar8 = vfmadd231ps_fma(auVar96,auVar159,local_b90);
      auVar134._0_4_ = fVar5 * auVar102._0_4_;
      auVar134._4_4_ = fVar5 * auVar102._4_4_;
      auVar134._8_4_ = fVar5 * auVar102._8_4_;
      auVar134._12_4_ = fVar5 * auVar102._12_4_;
      auVar102 = vfmadd231ps_fma(auVar134,auVar159,auVar103);
      auVar116._0_4_ = auVar162._0_4_ * fVar5;
      auVar116._4_4_ = auVar162._4_4_ * fVar5;
      auVar116._8_4_ = auVar162._8_4_ * fVar5;
      auVar116._12_4_ = auVar162._12_4_ * fVar5;
      auVar103 = vfmadd231ps_fma(auVar116,auVar159,auVar104);
      auVar162._0_4_ = fVar5 * auVar123._0_4_;
      auVar162._4_4_ = fVar5 * auVar123._4_4_;
      auVar162._8_4_ = fVar5 * auVar123._8_4_;
      auVar162._12_4_ = fVar5 * auVar123._12_4_;
      auVar162 = vfmadd231ps_fma(auVar162,auVar159,auVar90);
      auVar123._0_4_ = fVar5 * auVar88._0_4_;
      auVar123._4_4_ = fVar5 * auVar88._4_4_;
      auVar123._8_4_ = fVar5 * auVar88._8_4_;
      auVar123._12_4_ = fVar5 * auVar88._12_4_;
      auVar88 = vfmadd231ps_fma(auVar123,auVar159,auVar108);
      auVar104._0_4_ = auVar144._0_4_ * fVar5;
      auVar104._4_4_ = auVar144._4_4_ * fVar5;
      auVar104._8_4_ = auVar144._8_4_ * fVar5;
      auVar104._12_4_ = auVar144._12_4_ * fVar5;
      auVar108 = vfmadd231ps_fma(auVar104,auVar159,auVar110);
      auVar110._0_4_ = fVar5 * auVar152._0_4_;
      auVar110._4_4_ = fVar5 * auVar152._4_4_;
      auVar110._8_4_ = fVar5 * auVar152._8_4_;
      auVar110._12_4_ = fVar5 * auVar152._12_4_;
      auVar110 = vfmadd231ps_fma(auVar110,auVar159,auVar140);
      auVar144._0_4_ = auVar109._0_4_ * fVar5;
      auVar144._4_4_ = auVar109._4_4_ * fVar5;
      auVar144._8_4_ = auVar109._8_4_ * fVar5;
      auVar144._12_4_ = auVar109._12_4_ * fVar5;
      auVar109 = vfmadd231ps_fma(auVar144,auVar159,local_bc0);
      auVar152._0_4_ = auVar41._0_4_ * fVar5;
      auVar152._4_4_ = auVar41._4_4_ * fVar5;
      auVar152._8_4_ = auVar41._8_4_ * fVar5;
      auVar152._12_4_ = auVar41._12_4_ * fVar5;
      auVar104 = vfmadd231ps_fma(auVar152,auVar159,auVar137);
      auVar137._0_4_ = fVar5 * auVar115._0_4_;
      auVar137._4_4_ = fVar5 * auVar115._4_4_;
      auVar137._8_4_ = fVar5 * auVar115._8_4_;
      auVar137._12_4_ = fVar5 * auVar115._12_4_;
      auVar140._0_4_ = auVar89._0_4_ * fVar5;
      auVar140._4_4_ = auVar89._4_4_ * fVar5;
      auVar140._8_4_ = auVar89._8_4_ * fVar5;
      auVar140._12_4_ = auVar89._12_4_ * fVar5;
      lVar12 = uVar62 + 0x40 + lVar63;
      local_b00 = *(undefined8 *)(lVar12 + 0x10);
      uStack_af8 = *(undefined8 *)(lVar12 + 0x18);
      auVar90._0_4_ = auVar95._0_4_ * fVar5;
      auVar90._4_4_ = auVar95._4_4_ * fVar5;
      auVar90._8_4_ = auVar95._8_4_ * fVar5;
      auVar90._12_4_ = auVar95._12_4_ * fVar5;
      uStack_af0 = local_b00;
      uStack_ae8 = uStack_af8;
      lVar63 = uVar62 + 0x50 + lVar63;
      local_b20 = *(undefined8 *)(lVar63 + 0x10);
      uStack_b18 = *(undefined8 *)(lVar63 + 0x18);
      auVar89 = vfmadd231ps_fma(auVar137,auVar159,local_ba0);
      auVar95 = vfmadd231ps_fma(auVar140,auVar159,local_bb0);
      auVar115 = vfmadd231ps_fma(auVar90,auVar159,auVar7);
      uStack_b10 = local_b20;
      uStack_b08 = uStack_b18;
      auVar98._16_16_ = auVar110;
      auVar98._0_16_ = auVar8;
      auVar111._16_16_ = auVar109;
      auVar111._0_16_ = auVar102;
      auVar117._16_16_ = auVar104;
      auVar117._0_16_ = auVar103;
      auVar135._16_16_ = auVar162;
      auVar135._0_16_ = auVar162;
      auVar124._16_16_ = auVar88;
      auVar124._0_16_ = auVar88;
      auVar105._16_16_ = auVar108;
      auVar105._0_16_ = auVar108;
      auVar163._16_16_ = auVar89;
      auVar163._0_16_ = auVar89;
      auVar160._16_16_ = auVar95;
      auVar160._0_16_ = auVar95;
      uVar1 = *(undefined4 *)(ray + k * 4);
      auVar153._4_4_ = uVar1;
      auVar153._0_4_ = uVar1;
      auVar153._8_4_ = uVar1;
      auVar153._12_4_ = uVar1;
      auVar153._16_4_ = uVar1;
      auVar153._20_4_ = uVar1;
      auVar153._24_4_ = uVar1;
      auVar153._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar156._4_4_ = uVar1;
      auVar156._0_4_ = uVar1;
      auVar156._8_4_ = uVar1;
      auVar156._12_4_ = uVar1;
      auVar156._16_4_ = uVar1;
      auVar156._20_4_ = uVar1;
      auVar156._24_4_ = uVar1;
      auVar156._28_4_ = uVar1;
      auVar93._16_16_ = auVar115;
      auVar93._0_16_ = auVar115;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar158._4_4_ = uVar1;
      auVar158._0_4_ = uVar1;
      auVar158._8_4_ = uVar1;
      auVar158._12_4_ = uVar1;
      auVar158._16_4_ = uVar1;
      auVar158._20_4_ = uVar1;
      auVar158._24_4_ = uVar1;
      auVar158._28_4_ = uVar1;
      auVar98 = vsubps_avx(auVar98,auVar153);
      auVar111 = vsubps_avx(auVar111,auVar156);
      local_c00 = vsubps_avx(auVar117,auVar158);
      auVar91 = vsubps_avx(auVar135,auVar153);
      auVar92 = vsubps_avx(auVar124,auVar156);
      auVar97 = vsubps_avx(auVar105,auVar158);
      auVar105 = vsubps_avx(auVar163,auVar153);
      auVar117 = vsubps_avx(auVar160,auVar156);
      auVar38 = vsubps_avx(auVar93,auVar158);
      local_c20 = vsubps_avx(auVar105,auVar98);
      local_c60 = vsubps_avx(auVar117,auVar111);
      local_c40 = vsubps_avx(auVar38,local_c00);
      auVar94._0_4_ = auVar98._0_4_ + auVar105._0_4_;
      auVar94._4_4_ = auVar98._4_4_ + auVar105._4_4_;
      auVar94._8_4_ = auVar98._8_4_ + auVar105._8_4_;
      auVar94._12_4_ = auVar98._12_4_ + auVar105._12_4_;
      auVar94._16_4_ = auVar98._16_4_ + auVar105._16_4_;
      auVar94._20_4_ = auVar98._20_4_ + auVar105._20_4_;
      auVar94._24_4_ = auVar98._24_4_ + auVar105._24_4_;
      auVar94._28_4_ = auVar98._28_4_ + auVar105._28_4_;
      auVar106._0_4_ = auVar117._0_4_ + auVar111._0_4_;
      auVar106._4_4_ = auVar117._4_4_ + auVar111._4_4_;
      auVar106._8_4_ = auVar117._8_4_ + auVar111._8_4_;
      auVar106._12_4_ = auVar117._12_4_ + auVar111._12_4_;
      auVar106._16_4_ = auVar117._16_4_ + auVar111._16_4_;
      auVar106._20_4_ = auVar117._20_4_ + auVar111._20_4_;
      auVar106._24_4_ = auVar117._24_4_ + auVar111._24_4_;
      fVar121 = auVar111._28_4_;
      auVar106._28_4_ = auVar117._28_4_ + fVar121;
      fVar5 = local_c00._0_4_;
      auVar118._0_4_ = auVar38._0_4_ + fVar5;
      fVar40 = local_c00._4_4_;
      auVar118._4_4_ = auVar38._4_4_ + fVar40;
      fVar16 = local_c00._8_4_;
      auVar118._8_4_ = auVar38._8_4_ + fVar16;
      fVar17 = local_c00._12_4_;
      auVar118._12_4_ = auVar38._12_4_ + fVar17;
      fVar18 = local_c00._16_4_;
      auVar118._16_4_ = auVar38._16_4_ + fVar18;
      fVar19 = local_c00._20_4_;
      auVar118._20_4_ = auVar38._20_4_ + fVar19;
      fVar20 = local_c00._24_4_;
      fVar142 = auVar38._28_4_;
      auVar118._24_4_ = auVar38._24_4_ + fVar20;
      auVar118._28_4_ = fVar142 + local_c00._28_4_;
      auVar39._4_4_ = local_c40._4_4_ * auVar106._4_4_;
      auVar39._0_4_ = local_c40._0_4_ * auVar106._0_4_;
      auVar39._8_4_ = local_c40._8_4_ * auVar106._8_4_;
      auVar39._12_4_ = local_c40._12_4_ * auVar106._12_4_;
      auVar39._16_4_ = local_c40._16_4_ * auVar106._16_4_;
      auVar39._20_4_ = local_c40._20_4_ * auVar106._20_4_;
      auVar39._24_4_ = local_c40._24_4_ * auVar106._24_4_;
      auVar39._28_4_ = uVar1;
      auVar95 = vfmsub231ps_fma(auVar39,local_c60,auVar118);
      auVar42._4_4_ = local_c20._4_4_ * auVar118._4_4_;
      auVar42._0_4_ = local_c20._0_4_ * auVar118._0_4_;
      auVar42._8_4_ = local_c20._8_4_ * auVar118._8_4_;
      auVar42._12_4_ = local_c20._12_4_ * auVar118._12_4_;
      auVar42._16_4_ = local_c20._16_4_ * auVar118._16_4_;
      auVar42._20_4_ = local_c20._20_4_ * auVar118._20_4_;
      auVar42._24_4_ = local_c20._24_4_ * auVar118._24_4_;
      auVar42._28_4_ = auVar118._28_4_;
      auVar89 = vfmsub231ps_fma(auVar42,local_c40,auVar94);
      auVar43._4_4_ = local_c60._4_4_ * auVar94._4_4_;
      auVar43._0_4_ = local_c60._0_4_ * auVar94._0_4_;
      auVar43._8_4_ = local_c60._8_4_ * auVar94._8_4_;
      auVar43._12_4_ = local_c60._12_4_ * auVar94._12_4_;
      auVar43._16_4_ = local_c60._16_4_ * auVar94._16_4_;
      auVar43._20_4_ = local_c60._20_4_ * auVar94._20_4_;
      auVar43._24_4_ = local_c60._24_4_ * auVar94._24_4_;
      auVar43._28_4_ = auVar94._28_4_;
      auVar102 = vfmsub231ps_fma(auVar43,local_c20,auVar106);
      uVar1 = *(undefined4 *)(ray + k * 4 + 0xa0);
      auVar157._4_4_ = uVar1;
      auVar157._0_4_ = uVar1;
      auVar157._8_4_ = uVar1;
      auVar157._12_4_ = uVar1;
      auVar157._16_4_ = uVar1;
      auVar157._20_4_ = uVar1;
      auVar157._24_4_ = uVar1;
      auVar157._28_4_ = uVar1;
      fStack_c70 = *(float *)(ray + k * 4 + 0xc0);
      auVar44._4_4_ = fStack_c70 * auVar102._4_4_;
      auVar44._0_4_ = fStack_c70 * auVar102._0_4_;
      auVar44._8_4_ = fStack_c70 * auVar102._8_4_;
      auVar44._12_4_ = fStack_c70 * auVar102._12_4_;
      auVar44._16_4_ = fStack_c70 * 0.0;
      auVar44._20_4_ = fStack_c70 * 0.0;
      auVar44._24_4_ = fStack_c70 * 0.0;
      auVar44._28_4_ = auVar106._28_4_;
      auVar89 = vfmadd231ps_fma(auVar44,auVar157,ZEXT1632(auVar89));
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar161._4_4_ = uVar1;
      auVar161._0_4_ = uVar1;
      auVar161._8_4_ = uVar1;
      auVar161._12_4_ = uVar1;
      auVar161._16_4_ = uVar1;
      auVar161._20_4_ = uVar1;
      auVar161._24_4_ = uVar1;
      auVar161._28_4_ = uVar1;
      auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar161,ZEXT1632(auVar95));
      local_ca0 = vsubps_avx(auVar111,auVar92);
      local_ce0 = vsubps_avx(local_c00,auVar97);
      auVar125._0_4_ = auVar92._0_4_ + auVar111._0_4_;
      auVar125._4_4_ = auVar92._4_4_ + auVar111._4_4_;
      auVar125._8_4_ = auVar92._8_4_ + auVar111._8_4_;
      auVar125._12_4_ = auVar92._12_4_ + auVar111._12_4_;
      auVar125._16_4_ = auVar92._16_4_ + auVar111._16_4_;
      auVar125._20_4_ = auVar92._20_4_ + auVar111._20_4_;
      auVar125._24_4_ = auVar92._24_4_ + auVar111._24_4_;
      auVar125._28_4_ = auVar92._28_4_ + fVar121;
      auVar119._0_4_ = fVar5 + auVar97._0_4_;
      auVar119._4_4_ = fVar40 + auVar97._4_4_;
      auVar119._8_4_ = fVar16 + auVar97._8_4_;
      auVar119._12_4_ = fVar17 + auVar97._12_4_;
      auVar119._16_4_ = fVar18 + auVar97._16_4_;
      auVar119._20_4_ = fVar19 + auVar97._20_4_;
      auVar119._24_4_ = fVar20 + auVar97._24_4_;
      auVar119._28_4_ = local_c00._28_4_ + auVar97._28_4_;
      fVar127 = local_ce0._0_4_;
      fVar129 = local_ce0._4_4_;
      auVar45._4_4_ = auVar125._4_4_ * fVar129;
      auVar45._0_4_ = auVar125._0_4_ * fVar127;
      fVar132 = local_ce0._8_4_;
      auVar45._8_4_ = auVar125._8_4_ * fVar132;
      fVar23 = local_ce0._12_4_;
      auVar45._12_4_ = auVar125._12_4_ * fVar23;
      fVar26 = local_ce0._16_4_;
      auVar45._16_4_ = auVar125._16_4_ * fVar26;
      fVar29 = local_ce0._20_4_;
      auVar45._20_4_ = auVar125._20_4_ * fVar29;
      fVar32 = local_ce0._24_4_;
      auVar45._24_4_ = auVar125._24_4_ * fVar32;
      auVar45._28_4_ = fVar121;
      auVar102 = vfmsub231ps_fma(auVar45,local_ca0,auVar119);
      local_cc0 = vsubps_avx(auVar98,auVar91);
      fVar121 = local_cc0._0_4_;
      fVar130 = local_cc0._4_4_;
      auVar46._4_4_ = auVar119._4_4_ * fVar130;
      auVar46._0_4_ = auVar119._0_4_ * fVar121;
      fVar21 = local_cc0._8_4_;
      auVar46._8_4_ = auVar119._8_4_ * fVar21;
      fVar24 = local_cc0._12_4_;
      auVar46._12_4_ = auVar119._12_4_ * fVar24;
      fVar27 = local_cc0._16_4_;
      auVar46._16_4_ = auVar119._16_4_ * fVar27;
      fVar30 = local_cc0._20_4_;
      auVar46._20_4_ = auVar119._20_4_ * fVar30;
      fVar33 = local_cc0._24_4_;
      auVar46._24_4_ = auVar119._24_4_ * fVar33;
      auVar46._28_4_ = auVar119._28_4_;
      auVar145._0_4_ = auVar98._0_4_ + auVar91._0_4_;
      auVar145._4_4_ = auVar98._4_4_ + auVar91._4_4_;
      auVar145._8_4_ = auVar98._8_4_ + auVar91._8_4_;
      auVar145._12_4_ = auVar98._12_4_ + auVar91._12_4_;
      auVar145._16_4_ = auVar98._16_4_ + auVar91._16_4_;
      auVar145._20_4_ = auVar98._20_4_ + auVar91._20_4_;
      auVar145._24_4_ = auVar98._24_4_ + auVar91._24_4_;
      auVar145._28_4_ = auVar98._28_4_ + auVar91._28_4_;
      auVar95 = vfmsub231ps_fma(auVar46,local_ce0,auVar145);
      fVar128 = local_ca0._0_4_;
      fVar131 = local_ca0._4_4_;
      auVar47._4_4_ = auVar145._4_4_ * fVar131;
      auVar47._0_4_ = auVar145._0_4_ * fVar128;
      fVar22 = local_ca0._8_4_;
      auVar47._8_4_ = auVar145._8_4_ * fVar22;
      fVar25 = local_ca0._12_4_;
      auVar47._12_4_ = auVar145._12_4_ * fVar25;
      fVar28 = local_ca0._16_4_;
      auVar47._16_4_ = auVar145._16_4_ * fVar28;
      fVar31 = local_ca0._20_4_;
      auVar47._20_4_ = auVar145._20_4_ * fVar31;
      fVar34 = local_ca0._24_4_;
      auVar47._24_4_ = auVar145._24_4_ * fVar34;
      auVar47._28_4_ = auVar145._28_4_;
      auVar88 = vfmsub231ps_fma(auVar47,local_cc0,auVar125);
      auVar48._4_4_ = auVar88._4_4_ * fStack_c70;
      auVar48._0_4_ = auVar88._0_4_ * fStack_c70;
      auVar48._8_4_ = auVar88._8_4_ * fStack_c70;
      auVar48._12_4_ = auVar88._12_4_ * fStack_c70;
      auVar48._16_4_ = fStack_c70 * 0.0;
      auVar48._20_4_ = fStack_c70 * 0.0;
      auVar48._24_4_ = fStack_c70 * 0.0;
      auVar48._28_4_ = local_ce0._28_4_;
      auVar95 = vfmadd231ps_fma(auVar48,auVar157,ZEXT1632(auVar95));
      auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar161,ZEXT1632(auVar102));
      auVar39 = vsubps_avx(auVar91,auVar105);
      auVar112._0_4_ = auVar91._0_4_ + auVar105._0_4_;
      auVar112._4_4_ = auVar91._4_4_ + auVar105._4_4_;
      auVar112._8_4_ = auVar91._8_4_ + auVar105._8_4_;
      auVar112._12_4_ = auVar91._12_4_ + auVar105._12_4_;
      auVar112._16_4_ = auVar91._16_4_ + auVar105._16_4_;
      auVar112._20_4_ = auVar91._20_4_ + auVar105._20_4_;
      auVar112._24_4_ = auVar91._24_4_ + auVar105._24_4_;
      auVar112._28_4_ = auVar91._28_4_ + auVar105._28_4_;
      auVar105 = vsubps_avx(auVar92,auVar117);
      auVar126._0_4_ = auVar92._0_4_ + auVar117._0_4_;
      auVar126._4_4_ = auVar92._4_4_ + auVar117._4_4_;
      auVar126._8_4_ = auVar92._8_4_ + auVar117._8_4_;
      auVar126._12_4_ = auVar92._12_4_ + auVar117._12_4_;
      auVar126._16_4_ = auVar92._16_4_ + auVar117._16_4_;
      auVar126._20_4_ = auVar92._20_4_ + auVar117._20_4_;
      auVar126._24_4_ = auVar92._24_4_ + auVar117._24_4_;
      auVar126._28_4_ = auVar92._28_4_ + auVar117._28_4_;
      auVar117 = vsubps_avx(auVar97,auVar38);
      auVar99._0_4_ = auVar97._0_4_ + auVar38._0_4_;
      auVar99._4_4_ = auVar97._4_4_ + auVar38._4_4_;
      auVar99._8_4_ = auVar97._8_4_ + auVar38._8_4_;
      auVar99._12_4_ = auVar97._12_4_ + auVar38._12_4_;
      auVar99._16_4_ = auVar97._16_4_ + auVar38._16_4_;
      auVar99._20_4_ = auVar97._20_4_ + auVar38._20_4_;
      auVar99._24_4_ = auVar97._24_4_ + auVar38._24_4_;
      auVar99._28_4_ = auVar97._28_4_ + fVar142;
      auVar38._4_4_ = auVar117._4_4_ * auVar126._4_4_;
      auVar38._0_4_ = auVar117._0_4_ * auVar126._0_4_;
      auVar38._8_4_ = auVar117._8_4_ * auVar126._8_4_;
      auVar38._12_4_ = auVar117._12_4_ * auVar126._12_4_;
      auVar38._16_4_ = auVar117._16_4_ * auVar126._16_4_;
      auVar38._20_4_ = auVar117._20_4_ * auVar126._20_4_;
      auVar38._24_4_ = auVar117._24_4_ * auVar126._24_4_;
      auVar38._28_4_ = fVar142;
      auVar88 = vfmsub231ps_fma(auVar38,auVar105,auVar99);
      auVar49._4_4_ = auVar99._4_4_ * auVar39._4_4_;
      auVar49._0_4_ = auVar99._0_4_ * auVar39._0_4_;
      auVar49._8_4_ = auVar99._8_4_ * auVar39._8_4_;
      auVar49._12_4_ = auVar99._12_4_ * auVar39._12_4_;
      auVar49._16_4_ = auVar99._16_4_ * auVar39._16_4_;
      auVar49._20_4_ = auVar99._20_4_ * auVar39._20_4_;
      auVar49._24_4_ = auVar99._24_4_ * auVar39._24_4_;
      auVar49._28_4_ = auVar99._28_4_;
      auVar102 = vfmsub231ps_fma(auVar49,auVar117,auVar112);
      auVar50._4_4_ = auVar105._4_4_ * auVar112._4_4_;
      auVar50._0_4_ = auVar105._0_4_ * auVar112._0_4_;
      auVar50._8_4_ = auVar105._8_4_ * auVar112._8_4_;
      auVar50._12_4_ = auVar105._12_4_ * auVar112._12_4_;
      auVar50._16_4_ = auVar105._16_4_ * auVar112._16_4_;
      auVar50._20_4_ = auVar105._20_4_ * auVar112._20_4_;
      auVar50._24_4_ = auVar105._24_4_ * auVar112._24_4_;
      auVar50._28_4_ = auVar112._28_4_;
      auVar103 = vfmsub231ps_fma(auVar50,auVar39,auVar126);
      fStack_c7c = fStack_c70;
      local_c80 = fStack_c70;
      fStack_c78 = fStack_c70;
      fStack_c74 = fStack_c70;
      auVar113._0_4_ = fStack_c70 * auVar103._0_4_;
      auVar113._4_4_ = fStack_c70 * auVar103._4_4_;
      auVar113._8_4_ = fStack_c70 * auVar103._8_4_;
      auVar113._12_4_ = fStack_c70 * auVar103._12_4_;
      auVar113._16_4_ = fStack_c70 * 0.0;
      auVar113._20_4_ = fStack_c70 * 0.0;
      auVar113._24_4_ = fStack_c70 * 0.0;
      auVar113._28_4_ = 0;
      auVar102 = vfmadd231ps_fma(auVar113,auVar157,ZEXT1632(auVar102));
      auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar161,ZEXT1632(auVar88));
      local_ae0 = auVar89._0_4_;
      fStack_adc = auVar89._4_4_;
      fStack_ad8 = auVar89._8_4_;
      fStack_ad4 = auVar89._12_4_;
      local_aa0 = ZEXT1632(CONCAT412(auVar102._12_4_ + fStack_ad4 + auVar95._12_4_,
                                     CONCAT48(auVar102._8_4_ + fStack_ad8 + auVar95._8_4_,
                                              CONCAT44(auVar102._4_4_ + fStack_adc + auVar95._4_4_,
                                                       auVar102._0_4_ + local_ae0 + auVar95._0_4_)))
                          );
      auVar100._8_4_ = 0x7fffffff;
      auVar100._0_8_ = 0x7fffffff7fffffff;
      auVar100._12_4_ = 0x7fffffff;
      auVar100._16_4_ = 0x7fffffff;
      auVar100._20_4_ = 0x7fffffff;
      auVar100._24_4_ = 0x7fffffff;
      auVar100._28_4_ = 0x7fffffff;
      local_d00 = ZEXT1632(auVar89);
      auVar91 = vminps_avx(local_d00,ZEXT1632(auVar95));
      auVar91 = vminps_avx(auVar91,ZEXT1632(auVar102));
      local_d20 = vandps_avx(local_aa0,auVar100);
      fVar142 = local_d20._0_4_ * 1.1920929e-07;
      fVar146 = local_d20._4_4_ * 1.1920929e-07;
      auVar51._4_4_ = fVar146;
      auVar51._0_4_ = fVar142;
      fVar147 = local_d20._8_4_ * 1.1920929e-07;
      auVar51._8_4_ = fVar147;
      fVar148 = local_d20._12_4_ * 1.1920929e-07;
      auVar51._12_4_ = fVar148;
      fVar149 = local_d20._16_4_ * 1.1920929e-07;
      auVar51._16_4_ = fVar149;
      fVar150 = local_d20._20_4_ * 1.1920929e-07;
      auVar51._20_4_ = fVar150;
      fVar151 = local_d20._24_4_ * 1.1920929e-07;
      auVar51._24_4_ = fVar151;
      auVar51._28_4_ = 0x34000000;
      auVar138._0_8_ = CONCAT44(fVar146,fVar142) ^ 0x8000000080000000;
      auVar138._8_4_ = -fVar147;
      auVar138._12_4_ = -fVar148;
      auVar138._16_4_ = -fVar149;
      auVar138._20_4_ = -fVar150;
      auVar138._24_4_ = -fVar151;
      auVar138._28_4_ = 0xb4000000;
      auVar91 = vcmpps_avx(auVar91,auVar138,5);
      auVar97 = vmaxps_avx(local_d00,ZEXT1632(auVar95));
      auVar92 = vmaxps_avx(auVar97,ZEXT1632(auVar102));
      auVar92 = vcmpps_avx(auVar92,auVar51,2);
      auVar92 = vorps_avx(auVar91,auVar92);
      if ((((((((auVar92 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar92 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar92 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar92 >> 0x7f,0) != '\0') ||
            (auVar92 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar92 >> 0xbf,0) != '\0') ||
          (auVar92 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar92[0x1f] < '\0') {
        auVar52._4_4_ = fVar131 * local_c40._4_4_;
        auVar52._0_4_ = fVar128 * local_c40._0_4_;
        auVar52._8_4_ = fVar22 * local_c40._8_4_;
        auVar52._12_4_ = fVar25 * local_c40._12_4_;
        auVar52._16_4_ = fVar28 * local_c40._16_4_;
        auVar52._20_4_ = fVar31 * local_c40._20_4_;
        auVar52._24_4_ = fVar34 * local_c40._24_4_;
        auVar52._28_4_ = auVar91._28_4_;
        auVar53._4_4_ = fVar130 * local_c60._4_4_;
        auVar53._0_4_ = fVar121 * local_c60._0_4_;
        auVar53._8_4_ = fVar21 * local_c60._8_4_;
        auVar53._12_4_ = fVar24 * local_c60._12_4_;
        auVar53._16_4_ = fVar27 * local_c60._16_4_;
        auVar53._20_4_ = fVar30 * local_c60._20_4_;
        auVar53._24_4_ = fVar33 * local_c60._24_4_;
        auVar53._28_4_ = 0x34000000;
        auVar89 = vfmsub213ps_fma(local_c60,local_ce0,auVar52);
        auVar54._4_4_ = auVar105._4_4_ * fVar129;
        auVar54._0_4_ = auVar105._0_4_ * fVar127;
        auVar54._8_4_ = auVar105._8_4_ * fVar132;
        auVar54._12_4_ = auVar105._12_4_ * fVar23;
        auVar54._16_4_ = auVar105._16_4_ * fVar26;
        auVar54._20_4_ = auVar105._20_4_ * fVar29;
        auVar54._24_4_ = auVar105._24_4_ * fVar32;
        auVar54._28_4_ = auVar97._28_4_;
        auVar55._4_4_ = fVar130 * auVar117._4_4_;
        auVar55._0_4_ = fVar121 * auVar117._0_4_;
        auVar55._8_4_ = fVar21 * auVar117._8_4_;
        auVar55._12_4_ = fVar24 * auVar117._12_4_;
        auVar55._16_4_ = fVar27 * auVar117._16_4_;
        auVar55._20_4_ = fVar30 * auVar117._20_4_;
        auVar55._24_4_ = fVar33 * auVar117._24_4_;
        auVar55._28_4_ = local_d20._28_4_;
        auVar102 = vfmsub213ps_fma(auVar117,local_ca0,auVar54);
        auVar91 = vandps_avx(auVar52,auVar100);
        auVar97 = vandps_avx(auVar54,auVar100);
        auVar91 = vcmpps_avx(auVar91,auVar97,1);
        local_a80 = vblendvps_avx(ZEXT1632(auVar102),ZEXT1632(auVar89),auVar91);
        auVar56._4_4_ = fVar131 * auVar39._4_4_;
        auVar56._0_4_ = fVar128 * auVar39._0_4_;
        auVar56._8_4_ = fVar22 * auVar39._8_4_;
        auVar56._12_4_ = fVar25 * auVar39._12_4_;
        auVar56._16_4_ = fVar28 * auVar39._16_4_;
        auVar56._20_4_ = fVar31 * auVar39._20_4_;
        auVar56._24_4_ = fVar34 * auVar39._24_4_;
        auVar56._28_4_ = auVar91._28_4_;
        auVar89 = vfmsub213ps_fma(auVar39,local_ce0,auVar55);
        auVar57._4_4_ = local_c20._4_4_ * fVar129;
        auVar57._0_4_ = local_c20._0_4_ * fVar127;
        auVar57._8_4_ = local_c20._8_4_ * fVar132;
        auVar57._12_4_ = local_c20._12_4_ * fVar23;
        auVar57._16_4_ = local_c20._16_4_ * fVar26;
        auVar57._20_4_ = local_c20._20_4_ * fVar29;
        auVar57._24_4_ = local_c20._24_4_ * fVar32;
        auVar57._28_4_ = auVar97._28_4_;
        auVar102 = vfmsub213ps_fma(local_c40,local_cc0,auVar57);
        auVar91 = vandps_avx(auVar57,auVar100);
        auVar97 = vandps_avx(auVar55,auVar100);
        auVar91 = vcmpps_avx(auVar91,auVar97,1);
        local_a60 = vblendvps_avx(ZEXT1632(auVar89),ZEXT1632(auVar102),auVar91);
        auVar89 = vfmsub213ps_fma(local_c20,local_ca0,auVar53);
        auVar102 = vfmsub213ps_fma(auVar105,local_cc0,auVar56);
        auVar91 = vandps_avx(auVar53,auVar100);
        auVar97 = vandps_avx(auVar56,auVar100);
        auVar91 = vcmpps_avx(auVar91,auVar97,1);
        local_a40 = vblendvps_avx(ZEXT1632(auVar102),ZEXT1632(auVar89),auVar91);
        auVar89 = vpackssdw_avx(auVar92._0_16_,auVar92._16_16_);
        fVar121 = local_a40._0_4_;
        auVar101._0_4_ = fVar121 * fStack_c70;
        fVar127 = local_a40._4_4_;
        auVar101._4_4_ = fVar127 * fStack_c70;
        fVar128 = local_a40._8_4_;
        auVar101._8_4_ = fVar128 * fStack_c70;
        fVar129 = local_a40._12_4_;
        auVar101._12_4_ = fVar129 * fStack_c70;
        fVar130 = local_a40._16_4_;
        auVar101._16_4_ = fVar130 * fStack_c70;
        fVar131 = local_a40._20_4_;
        auVar101._20_4_ = fVar131 * fStack_c70;
        fVar132 = local_a40._24_4_;
        auVar101._24_4_ = fVar132 * fStack_c70;
        auVar101._28_4_ = 0;
        auVar102 = vfmadd213ps_fma(auVar157,local_a60,auVar101);
        auVar102 = vfmadd213ps_fma(auVar161,local_a80,ZEXT1632(auVar102));
        auVar97 = ZEXT1632(CONCAT412(auVar102._12_4_ + auVar102._12_4_,
                                     CONCAT48(auVar102._8_4_ + auVar102._8_4_,
                                              CONCAT44(auVar102._4_4_ + auVar102._4_4_,
                                                       auVar102._0_4_ + auVar102._0_4_))));
        auVar58._4_4_ = fVar127 * fVar40;
        auVar58._0_4_ = fVar121 * fVar5;
        auVar58._8_4_ = fVar128 * fVar16;
        auVar58._12_4_ = fVar129 * fVar17;
        auVar58._16_4_ = fVar130 * fVar18;
        auVar58._20_4_ = fVar131 * fVar19;
        auVar58._24_4_ = fVar132 * fVar20;
        auVar58._28_4_ = auVar92._28_4_;
        auVar102 = vfmadd213ps_fma(auVar111,local_a60,auVar58);
        auVar88 = vfmadd213ps_fma(auVar98,local_a80,ZEXT1632(auVar102));
        auVar91 = vrcpps_avx(auVar97);
        auVar154._8_4_ = 0x3f800000;
        auVar154._0_8_ = 0x3f8000003f800000;
        auVar154._12_4_ = 0x3f800000;
        auVar154._16_4_ = 0x3f800000;
        auVar154._20_4_ = 0x3f800000;
        auVar154._24_4_ = 0x3f800000;
        auVar154._28_4_ = 0x3f800000;
        auVar102 = vfnmadd213ps_fma(auVar91,auVar97,auVar154);
        auVar102 = vfmadd132ps_fma(ZEXT1632(auVar102),auVar91,auVar91);
        local_9c0 = ZEXT1632(CONCAT412(auVar102._12_4_ * (auVar88._12_4_ + auVar88._12_4_),
                                       CONCAT48(auVar102._8_4_ * (auVar88._8_4_ + auVar88._8_4_),
                                                CONCAT44(auVar102._4_4_ *
                                                         (auVar88._4_4_ + auVar88._4_4_),
                                                         auVar102._0_4_ *
                                                         (auVar88._0_4_ + auVar88._0_4_)))));
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
        auVar141._4_4_ = uVar1;
        auVar141._0_4_ = uVar1;
        auVar141._8_4_ = uVar1;
        auVar141._12_4_ = uVar1;
        auVar141._16_4_ = uVar1;
        auVar141._20_4_ = uVar1;
        auVar141._24_4_ = uVar1;
        auVar141._28_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar155._4_4_ = uVar1;
        auVar155._0_4_ = uVar1;
        auVar155._8_4_ = uVar1;
        auVar155._12_4_ = uVar1;
        auVar155._16_4_ = uVar1;
        auVar155._20_4_ = uVar1;
        auVar155._24_4_ = uVar1;
        auVar155._28_4_ = uVar1;
        auVar91 = vcmpps_avx(auVar141,local_9c0,2);
        auVar92 = vcmpps_avx(local_9c0,auVar155,2);
        auVar91 = vandps_avx(auVar91,auVar92);
        auVar102 = vpackssdw_avx(auVar91._0_16_,auVar91._16_16_);
        auVar89 = vpand_avx(auVar102,auVar89);
        auVar91 = vpmovsxwd_avx2(auVar89);
        if ((((((((auVar91 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar91 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar91 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar91 >> 0x7f,0) != '\0') ||
              (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar91 >> 0xbf,0) != '\0') ||
            (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar91[0x1f] < '\0') {
          auVar91 = vcmpps_avx(auVar97,_DAT_01f7b000,4);
          auVar102 = vpackssdw_avx(auVar91._0_16_,auVar91._16_16_);
          auVar89 = vpand_avx(auVar89,auVar102);
          local_a20 = vpmovsxwd_avx2(auVar89);
          if ((((((((local_a20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (local_a20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_a20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(local_a20 >> 0x7f,0) != '\0') ||
                (local_a20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(local_a20 >> 0xbf,0) != '\0') ||
              (local_a20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              local_a20[0x1f] < '\0') {
            uStack_ad0 = 0;
            uStack_acc = 0;
            uStack_ac8 = 0;
            uStack_ac4 = 0;
            local_ac0 = ZEXT1632(auVar95);
            local_940 = local_b40;
            auVar91 = vrcpps_avx(local_aa0);
            auVar120._8_4_ = 0x3f800000;
            auVar120._0_8_ = 0x3f8000003f800000;
            auVar120._12_4_ = 0x3f800000;
            auVar120._16_4_ = 0x3f800000;
            auVar120._20_4_ = 0x3f800000;
            auVar120._24_4_ = 0x3f800000;
            auVar120._28_4_ = 0x3f800000;
            auVar102 = vfnmadd213ps_fma(local_aa0,auVar91,auVar120);
            auVar102 = vfmadd132ps_fma(ZEXT1632(auVar102),auVar91,auVar91);
            auVar114._8_4_ = 0x219392ef;
            auVar114._0_8_ = 0x219392ef219392ef;
            auVar114._12_4_ = 0x219392ef;
            auVar114._16_4_ = 0x219392ef;
            auVar114._20_4_ = 0x219392ef;
            auVar114._24_4_ = 0x219392ef;
            auVar114._28_4_ = 0x219392ef;
            auVar91 = vcmpps_avx(local_d20,auVar114,5);
            auVar91 = vandps_avx(auVar91,ZEXT1632(auVar102));
            auVar59._4_4_ = fStack_adc * auVar91._4_4_;
            auVar59._0_4_ = local_ae0 * auVar91._0_4_;
            auVar59._8_4_ = fStack_ad8 * auVar91._8_4_;
            auVar59._12_4_ = fStack_ad4 * auVar91._12_4_;
            auVar59._16_4_ = auVar91._16_4_ * 0.0;
            auVar59._20_4_ = auVar91._20_4_ * 0.0;
            auVar59._24_4_ = auVar91._24_4_ * 0.0;
            auVar59._28_4_ = 0;
            auVar92 = vminps_avx(auVar59,auVar120);
            auVar60._4_4_ = auVar95._4_4_ * auVar91._4_4_;
            auVar60._0_4_ = auVar95._0_4_ * auVar91._0_4_;
            auVar60._8_4_ = auVar95._8_4_ * auVar91._8_4_;
            auVar60._12_4_ = auVar95._12_4_ * auVar91._12_4_;
            auVar60._16_4_ = auVar91._16_4_ * 0.0;
            auVar60._20_4_ = auVar91._20_4_ * 0.0;
            auVar60._24_4_ = auVar91._24_4_ * 0.0;
            auVar60._28_4_ = local_ce0._28_4_;
            auVar91 = vminps_avx(auVar60,auVar120);
            auVar97 = vsubps_avx(auVar120,auVar92);
            auVar98 = vsubps_avx(auVar120,auVar91);
            local_9e0 = vblendvps_avx(auVar91,auVar97,local_b40);
            local_a00 = vblendvps_avx(auVar92,auVar98,local_b40);
            local_980._4_4_ = (float)local_b60._4_4_ * local_a60._4_4_;
            local_980._0_4_ = (float)local_b60._0_4_ * local_a60._0_4_;
            local_980._8_4_ = fStack_b58 * local_a60._8_4_;
            local_980._12_4_ = fStack_b54 * local_a60._12_4_;
            local_980._16_4_ = fStack_b50 * local_a60._16_4_;
            local_980._20_4_ = fStack_b4c * local_a60._20_4_;
            local_980._24_4_ = fStack_b48 * local_a60._24_4_;
            local_980._28_4_ = local_9e0._28_4_;
            local_960._4_4_ = (float)local_b60._4_4_ * fVar127;
            local_960._0_4_ = (float)local_b60._0_4_ * fVar121;
            local_960._8_4_ = fStack_b58 * fVar128;
            local_960._12_4_ = fStack_b54 * fVar129;
            local_960._16_4_ = fStack_b50 * fVar130;
            local_960._20_4_ = fStack_b4c * fVar131;
            local_960._24_4_ = fStack_b48 * fVar132;
            local_960._28_4_ = uStack_b44;
            local_9a0[0] = local_a80._0_4_ * (float)local_b60._0_4_;
            local_9a0[1] = local_a80._4_4_ * (float)local_b60._4_4_;
            local_9a0[2] = local_a80._8_4_ * fStack_b58;
            local_9a0[3] = local_a80._12_4_ * fStack_b54;
            fStack_990 = local_a80._16_4_ * fStack_b50;
            fStack_98c = local_a80._20_4_ * fStack_b4c;
            fStack_988 = local_a80._24_4_ * fStack_b48;
            uStack_984 = local_a00._28_4_;
            auVar89 = vpacksswb_avx(auVar89,auVar89);
            uVar65 = (ulong)(byte)(SUB161(auVar89 >> 7,0) & 1 | (SUB161(auVar89 >> 0xf,0) & 1) << 1
                                   | (SUB161(auVar89 >> 0x17,0) & 1) << 2 |
                                   (SUB161(auVar89 >> 0x1f,0) & 1) << 3 |
                                   (SUB161(auVar89 >> 0x27,0) & 1) << 4 |
                                   (SUB161(auVar89 >> 0x2f,0) & 1) << 5 |
                                   (SUB161(auVar89 >> 0x37,0) & 1) << 6 |
                                  SUB161(auVar89 >> 0x3f,0) << 7);
            fStack_c6c = fStack_c70;
            fStack_c68 = fStack_c70;
            fStack_c64 = fStack_c70;
            do {
              uVar71 = 0;
              for (uVar67 = uVar65; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
                uVar71 = uVar71 + 1;
              }
              uVar64 = *(uint *)((long)&local_b00 + uVar71 * 4);
              pGVar11 = (pSVar9->geometries).items[uVar64].ptr;
              if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  uVar67 = (ulong)(uint)((int)uVar71 * 4);
                  local_8c0 = *(undefined4 *)(local_a00 + uVar67);
                  local_8a0 = *(undefined4 *)(local_9e0 + uVar67);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_9c0 + uVar67);
                  local_d50.context = context->user;
                  uVar6 = *(undefined4 *)((long)&local_b20 + uVar67);
                  local_880._4_4_ = uVar6;
                  local_880._0_4_ = uVar6;
                  local_880._8_4_ = uVar6;
                  local_880._12_4_ = uVar6;
                  local_880._16_4_ = uVar6;
                  local_880._20_4_ = uVar6;
                  local_880._24_4_ = uVar6;
                  local_880._28_4_ = uVar6;
                  uVar6 = *(undefined4 *)((long)local_9a0 + uVar67);
                  local_900 = *(undefined4 *)(local_980 + uVar67);
                  local_8e0 = *(undefined4 *)(local_960 + uVar67);
                  local_860._4_4_ = uVar64;
                  local_860._0_4_ = uVar64;
                  local_860._8_4_ = uVar64;
                  local_860._12_4_ = uVar64;
                  local_860._16_4_ = uVar64;
                  local_860._20_4_ = uVar64;
                  local_860._24_4_ = uVar64;
                  local_860._28_4_ = uVar64;
                  local_920[0] = (RTCHitN)(char)uVar6;
                  local_920[1] = (RTCHitN)(char)((uint)uVar6 >> 8);
                  local_920[2] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
                  local_920[3] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
                  local_920[4] = (RTCHitN)(char)uVar6;
                  local_920[5] = (RTCHitN)(char)((uint)uVar6 >> 8);
                  local_920[6] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
                  local_920[7] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
                  local_920[8] = (RTCHitN)(char)uVar6;
                  local_920[9] = (RTCHitN)(char)((uint)uVar6 >> 8);
                  local_920[10] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
                  local_920[0xb] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
                  local_920[0xc] = (RTCHitN)(char)uVar6;
                  local_920[0xd] = (RTCHitN)(char)((uint)uVar6 >> 8);
                  local_920[0xe] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
                  local_920[0xf] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
                  local_920[0x10] = (RTCHitN)(char)uVar6;
                  local_920[0x11] = (RTCHitN)(char)((uint)uVar6 >> 8);
                  local_920[0x12] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
                  local_920[0x13] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
                  local_920[0x14] = (RTCHitN)(char)uVar6;
                  local_920[0x15] = (RTCHitN)(char)((uint)uVar6 >> 8);
                  local_920[0x16] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
                  local_920[0x17] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
                  local_920[0x18] = (RTCHitN)(char)uVar6;
                  local_920[0x19] = (RTCHitN)(char)((uint)uVar6 >> 8);
                  local_920[0x1a] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
                  local_920[0x1b] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
                  local_920[0x1c] = (RTCHitN)(char)uVar6;
                  local_920[0x1d] = (RTCHitN)(char)((uint)uVar6 >> 8);
                  local_920[0x1e] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
                  local_920[0x1f] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
                  uStack_8fc = local_900;
                  uStack_8f8 = local_900;
                  uStack_8f4 = local_900;
                  uStack_8f0 = local_900;
                  uStack_8ec = local_900;
                  uStack_8e8 = local_900;
                  uStack_8e4 = local_900;
                  uStack_8dc = local_8e0;
                  uStack_8d8 = local_8e0;
                  uStack_8d4 = local_8e0;
                  uStack_8d0 = local_8e0;
                  uStack_8cc = local_8e0;
                  uStack_8c8 = local_8e0;
                  uStack_8c4 = local_8e0;
                  uStack_8bc = local_8c0;
                  uStack_8b8 = local_8c0;
                  uStack_8b4 = local_8c0;
                  uStack_8b0 = local_8c0;
                  uStack_8ac = local_8c0;
                  uStack_8a8 = local_8c0;
                  uStack_8a4 = local_8c0;
                  uStack_89c = local_8a0;
                  uStack_898 = local_8a0;
                  uStack_894 = local_8a0;
                  uStack_890 = local_8a0;
                  uStack_88c = local_8a0;
                  uStack_888 = local_8a0;
                  uStack_884 = local_8a0;
                  auVar91 = vpcmpeqd_avx2(local_860,local_860);
                  uStack_83c = (local_d50.context)->instID[0];
                  local_840 = uStack_83c;
                  uStack_838 = uStack_83c;
                  uStack_834 = uStack_83c;
                  uStack_830 = uStack_83c;
                  uStack_82c = uStack_83c;
                  uStack_828 = uStack_83c;
                  uStack_824 = uStack_83c;
                  uStack_81c = (local_d50.context)->instPrimID[0];
                  local_820 = uStack_81c;
                  uStack_818 = uStack_81c;
                  uStack_814 = uStack_81c;
                  uStack_810 = uStack_81c;
                  uStack_80c = uStack_81c;
                  uStack_808 = uStack_81c;
                  uStack_804 = uStack_81c;
                  local_be0 = local_b80;
                  local_d50.valid = (int *)local_be0;
                  local_d50.geometryUserPtr = pGVar11->userPtr;
                  local_d50.hit = local_920;
                  local_d50.N = 8;
                  local_d50.ray = (RTCRayN *)ray;
                  if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar91 = ZEXT1632(auVar91._0_16_);
                    (*pGVar11->occlusionFilterN)(&local_d50);
                    auVar91 = vpcmpeqd_avx2(auVar91,auVar91);
                  }
                  auVar97 = vpcmpeqd_avx2(local_be0,_DAT_01f7b000);
                  auVar92 = auVar91 & ~auVar97;
                  if ((((((((auVar92 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar92 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar92 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar92 >> 0x7f,0) == '\0') &&
                        (auVar92 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar92 >> 0xbf,0) == '\0') &&
                      (auVar92 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar92[0x1f]) {
                    auVar97 = auVar97 ^ auVar91;
                  }
                  else {
                    p_Var15 = context->args->filter;
                    if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar91 = ZEXT1632(auVar91._0_16_);
                      (*p_Var15)(&local_d50);
                      auVar91 = vpcmpeqd_avx2(auVar91,auVar91);
                    }
                    auVar92 = vpcmpeqd_avx2(local_be0,_DAT_01f7b000);
                    auVar97 = auVar92 ^ auVar91;
                    auVar107._8_4_ = 0xff800000;
                    auVar107._0_8_ = 0xff800000ff800000;
                    auVar107._12_4_ = 0xff800000;
                    auVar107._16_4_ = 0xff800000;
                    auVar107._20_4_ = 0xff800000;
                    auVar107._24_4_ = 0xff800000;
                    auVar107._28_4_ = 0xff800000;
                    auVar91 = vblendvps_avx(auVar107,*(undefined1 (*) [32])(local_d50.ray + 0x100),
                                            auVar92);
                    *(undefined1 (*) [32])(local_d50.ray + 0x100) = auVar91;
                  }
                  if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar97 >> 0x7f,0) == '\0') &&
                        (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar97 >> 0xbf,0) == '\0') &&
                      (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar97[0x1f]) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar1;
                    goto LAB_01610414;
                  }
                }
                *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                goto LAB_016105f0;
              }
LAB_01610414:
              uVar65 = uVar65 ^ 1L << (uVar71 & 0x3f);
            } while (uVar65 != 0);
          }
        }
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }